

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  WeightParamType WVar2;
  Result *pRVar3;
  LoadConstantNDLayerParams *this_00;
  uint64 uVar4;
  uint uVar5;
  int i;
  int index;
  WeightParams *pWVar6;
  string *psVar7;
  uint64_t expectedUnits;
  allocator local_c2;
  allocator local_c1;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  Result r;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,0,0);
  pRVar3 = Result::operator=(&r,(Result *)&err);
  bVar1 = Result::good(pRVar3);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    pRVar3 = Result::operator=(&r,(Result *)&err);
    bVar1 = Result::good(pRVar3);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    if (bVar1) {
      this_00 = Specification::NeuralNetworkLayer::loadconstantnd(layer);
      pWVar6 = this_00->data_;
      if (pWVar6 == (WeightParams *)0x0) {
        pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      WVar2 = valueType(pWVar6);
      uVar5 = (this_00->shape_).current_size_;
      if (uVar5 == 0) {
        std::operator+(&local_98,"Target shape is required parameter for \'",(layer->name_).ptr_);
        std::operator+(&err,&local_98,"\' layer.");
        std::__cxx11::string::~string((string *)&local_98);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        psVar7 = &err;
      }
      else {
        if (WVar2 == UNSPECIFIED) {
          std::operator+(&local_98,"LoadConstantND layer \'",(layer->name_).ptr_);
          std::operator+(&err,&local_98,
                         "\' has both full precision and half precision weight fields populated");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        }
        else {
          if (uVar5 < 6) {
            expectedUnits = 1;
            for (index = 0; index < (int)uVar5; index = index + 1) {
              uVar4 = Specification::LoadConstantNDLayerParams::shape(this_00,index);
              expectedUnits = expectedUnits * uVar4;
              uVar5 = (this_00->shape_).current_size_;
            }
            pWVar6 = this_00->data_;
            if (pWVar6 == (WeightParams *)0x0) {
              pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&local_98,"LoadConstantND",&local_c1);
            psVar7 = (layer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_50,"constants",&local_c2);
            validateGeneralWeightParams
                      ((Result *)&err,pWVar6,expectedUnits,1,&local_98,psVar7,&local_50);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_98);
            bVar1 = Result::good(&r);
            if (bVar1) {
              Result::Result(__return_storage_ptr__);
              goto LAB_0059f490;
            }
            goto LAB_0059f483;
          }
          std::operator+(&local_98,"LoadConstantND layer \'",(layer->name_).ptr_);
          std::operator+(&err,&local_98,"\'can only accept shape of length 1 to 5");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        }
        std::__cxx11::string::~string((string *)&err);
        psVar7 = &local_98;
      }
      std::__cxx11::string::~string((string *)psVar7);
      goto LAB_0059f490;
    }
  }
LAB_0059f483:
  Result::Result(__return_storage_ptr__,&r);
LAB_0059f490:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantNDLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 0, 0)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;

    const auto& params = layer.loadconstantnd();
    WeightParamType paramType = valueType(params.data());

    if (params.shape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "' has both full precision and half precision weight fields populated");
    }
    if (!(params.shape_size() >= 1 && params.shape_size() <= 5)) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "LoadConstantND layer '" + layer.name() + "'can only accept shape of length 1 to 5");
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }

    r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstantND", layer.name(), "constants");
    if (!r.good()) return r;

    return Result();
}